

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclibprs.cpp
# Opt level: O0

void __thiscall CTcLibParser::parse_lib(CTcLibParser *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  long *in_RDI;
  size_t rem;
  size_t symlen;
  int vallen;
  char *closep;
  size_t len2;
  char buf2 [128];
  char *var_val;
  char *var_name;
  char *sep;
  char *dst;
  char *p;
  size_t len;
  char expbuf [1024];
  char buf [1024];
  CTcSrcFile *fp;
  char *in_stack_fffffffffffff6f8;
  undefined4 in_stack_fffffffffffff700;
  byte bVar5;
  undefined1 in_stack_fffffffffffff705;
  undefined1 in_stack_fffffffffffff706;
  undefined1 uVar6;
  char *in_stack_fffffffffffff728;
  undefined8 local_8d0;
  undefined1 local_8c8 [128];
  char *local_848;
  char *local_840;
  char *local_838;
  char *local_830;
  char *local_828;
  long local_820;
  char local_818 [1023];
  char acStack_419 [1033];
  CTcSrcFile *local_10;
  
  local_10 = CTcSrcFile::open_ascii(in_stack_fffffffffffff728);
  if (local_10 == (CTcSrcFile *)0x0) {
    (**(code **)(*in_RDI + 0x10))();
    *(int *)(in_RDI + 3) = (int)in_RDI[3] + 1;
  }
  else {
LAB_0029f0b8:
    iVar1 = (*(local_10->super_CTcSrcObject)._vptr_CTcSrcObject[2])(local_10,acStack_419 + 1,0x400);
    local_820 = CONCAT44(extraout_var,iVar1);
    if (local_820 != 0) {
      in_RDI[4] = in_RDI[4] + 1;
      local_820 = local_820 + -1;
      while( true ) {
        uVar6 = false;
        if ((local_820 != 0) &&
           (in_stack_fffffffffffff706 = true, uVar6 = in_stack_fffffffffffff706,
           acStack_419[local_820] != '\n')) {
          in_stack_fffffffffffff706 = acStack_419[local_820] == '\r';
          uVar6 = in_stack_fffffffffffff706;
        }
        if ((bool)uVar6 == false) break;
        local_820 = local_820 + -1;
      }
      if (acStack_419[local_820 + 1] == '\0') {
        iVar1 = (*(local_10->super_CTcSrcObject)._vptr_CTcSrcObject[2])(local_10,local_8c8,0x80);
        local_8d0 = CONCAT44(extraout_var_00,iVar1);
        if (local_8d0 == 0) {
          local_8d0 = 0;
          goto LAB_0029f246;
        }
        (**(code **)(*in_RDI + 0x18))();
        *(int *)(in_RDI + 3) = (int)in_RDI[3] + 1;
        do {
          lVar3 = local_8d0;
          local_8d0 = local_8d0 + -1;
          if ((local_8d0 != 0) &&
             ((local_8c8[lVar3 + -2] == '\n' || (local_8c8[lVar3 + -2] == '\r'))))
          goto LAB_0029f0b8;
          iVar1 = (*(local_10->super_CTcSrcObject)._vptr_CTcSrcObject[2])(local_10,local_8c8,0x80);
          local_8d0 = CONCAT44(extraout_var_01,iVar1);
        } while (local_8d0 != 0);
        local_8d0 = 0;
      }
      else {
LAB_0029f246:
        acStack_419[local_820 + 1] = '\0';
        local_830 = local_818;
        pcVar2 = acStack_419;
LAB_0029f276:
        local_828 = pcVar2 + 1;
        if (*local_828 != '\0') {
          if (*local_828 == '$') {
            if (local_828[1] == '(') {
              pcVar2 = local_828 + 2;
              while( true ) {
                in_stack_fffffffffffff705 = false;
                if (*pcVar2 != '\0') {
                  in_stack_fffffffffffff705 = *pcVar2 != ')';
                }
                if ((bool)in_stack_fffffffffffff705 == false) break;
                pcVar2 = pcVar2 + 1;
              }
              if (*pcVar2 == ')') {
                local_828 = local_828 + 2;
                lVar3 = (long)pcVar2 - (long)local_828;
                uVar4 = 0x400 - ((long)local_830 - (long)local_818);
                iVar1 = (**(code **)(*in_RDI + 0xa8))(in_RDI,local_830,uVar4,local_828,lVar3);
                if (iVar1 < 0) {
                  (**(code **)(*in_RDI + 0x38))(in_RDI,local_828,lVar3);
                }
                else {
                  if (uVar4 < (ulong)(long)iVar1) {
                    (**(code **)(*in_RDI + 0x20))();
                    goto LAB_0029f4a1;
                  }
                  local_830 = local_830 + iVar1;
                }
                goto LAB_0029f276;
              }
              (**(code **)(*in_RDI + 0x40))();
            }
            else if (local_828[1] == '$') {
              local_828 = local_828 + 1;
            }
            else {
              (**(code **)(*in_RDI + 0x40))();
            }
          }
          if ((char *)0x400 < local_830 + (2 - (long)local_818)) {
            (**(code **)(*in_RDI + 0x20))();
            goto LAB_0029f4a1;
          }
          *local_830 = *local_828;
          local_830 = local_830 + 1;
          pcVar2 = local_828;
          goto LAB_0029f276;
        }
LAB_0029f4a1:
        *local_830 = '\0';
        local_828 = local_818;
        while (iVar1 = isspace((int)*local_828), iVar1 != 0) {
          local_828 = local_828 + 1;
        }
        if ((*local_828 != '\0') && (*local_828 != '#')) {
          local_840 = local_828;
          while( true ) {
            bVar5 = 0;
            if ((*local_828 != '\0') && (bVar5 = 0, *local_828 != ':')) {
              iVar1 = isspace((int)*local_828);
              bVar5 = iVar1 != 0 ^ 0xff;
            }
            if ((bVar5 & 1) == 0) break;
            local_828 = local_828 + 1;
          }
          local_838 = local_828;
          while (iVar1 = isspace((int)*local_828), iVar1 != 0) {
            local_828 = local_828 + 1;
          }
          if (*local_828 == ':') {
            *local_838 = '\0';
            do {
              local_828 = local_828 + 1;
              iVar1 = isspace((int)*local_828);
            } while (iVar1 != 0);
            local_848 = local_828;
            (**(code **)(*in_RDI + 0x58))(in_RDI,local_840,local_828);
          }
          else {
            iVar1 = stricmp((char *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffff706,
                                                            CONCAT15(in_stack_fffffffffffff705,
                                                                     CONCAT14(bVar5,
                                                  in_stack_fffffffffffff700)))),
                            in_stack_fffffffffffff6f8);
            if (iVar1 == 0) {
              (**(code **)(*in_RDI + 0xb0))();
            }
            else {
              (**(code **)(*in_RDI + 0x28))();
              *(int *)(in_RDI + 3) = (int)in_RDI[3] + 1;
            }
          }
        }
      }
      goto LAB_0029f0b8;
    }
    if (local_10 != (CTcSrcFile *)0x0) {
      (*(local_10->super_CTcSrcObject)._vptr_CTcSrcObject[1])();
    }
  }
  return;
}

Assistant:

void CTcLibParser::parse_lib()
{
    CTcSrcFile *fp;

    /* open our file - we only accept plain ASCII here */
    fp = CTcSrcFile::open_ascii(lib_name_);

    /* if that failed, abort */
    if (fp == 0)
    {
        err_open_file();
        ++err_cnt_;
        return;
    }

    /* keep going until we run out of file */
    for (;;)
    {
        char buf[1024];
        char expbuf[1024];
        size_t len;
        char *p;
        char *dst;
        char *sep;
        char *var_name;
        char *var_val;

        /* read the next line of text */
        if ((len = fp->read_line(buf, sizeof(buf))) == 0)
            break;

        /* count the line */
        ++linenum_;

        /* un-count the terminating null byte in the length */
        --len;

        /* check for a terminating newline sequence */
        while (len != 0 && (buf[len-1] == '\n' || buf[len-1] == '\r'))
            --len;

        /* if we didn't find a newline, the line is too long */
        if (buf[len] == '\0')
        {
            char buf2[128];
            size_t len2;
            
            /* 
             *   If we can read anything more from the file, this indicates
             *   that the line was simply too long to read into our buffer;
             *   skip the rest of the line and log an error in this case.
             *   If we can't read any more text, it means we've reached the
             *   end of the file. 
             */
            if ((len2 = fp->read_line(buf2, sizeof(buf2))) != 0)
            {
                /* there's more, so the line is too long - flag an error */
                err_line_too_long();
                ++err_cnt_;

                /* skip text until we find a newline */
                for (;;)
                {
                    /* un-count the null terminator */
                    --len2;

                    /* if we've found our newline, we're done skipping */
                    if (len2 != 0
                        && (buf2[len2-1] == '\n' || buf2[len2-1] == '\r'))
                        break;
                    
                    /* read another chunk */
                    if ((len2 = fp->read_line(buf2, sizeof(buf2))) == 0)
                        break;
                }

                /* we've skipped the line, so go back for the next */
                continue;
            }
        }

        /* remove the newline from the buffer */
        buf[len] = '\0';

        /* scan for and expand preprocessor symbols */
        for (p = buf, dst = expbuf ; *p != '\0' ; ++p)
        {
            /* check for the start of a preprocessor symbol */
            if (*p == '$')
            {
                /* 
                 *   We have a dollar sign, so this *could* be a preprocessor
                 *   symbol.  If the next character is '(', then find the
                 *   matching ')', and take the part between the parentheses
                 *   as a symbol to expand.  If the next character is '$',
                 *   replace the pair with a single dollar sign.  If the next
                 *   character is anything else, the '$' is not significant,
                 *   so leave it as it is.  
                 */
                if (*(p+1) == '(')
                {
                    char *closep;

                    /* find the close paren */
                    for (closep = p + 2 ; *closep != '\0' && *closep != ')' ;
                         ++closep) ;

                    /* 
                     *   if we found the close paren, process it; if not,
                     *   just ignore the whole thing and treat the '$(' as a
                     *   pair of ordinary characters 
                     */
                    if (*closep == ')')
                    {
                        int vallen;
                        size_t symlen;
                        size_t rem;

                        /* skip to the start of the symbol name */
                        p += 2;

                        /* get the length of the symbol */
                        symlen = closep - p;

                        /* figure out how much space we have left */
                        rem = sizeof(expbuf) - (dst - expbuf);

                        /* look up the symbol's value */
                        vallen = get_pp_symbol(dst, rem, p, symlen);

                        /* note overflow or undefined symbol errors */
                        if (vallen < 0)
                        {
                            /* it's undefined - note it */
                            err_undef_sym(p, symlen);
                        }
                        else if ((size_t)vallen > rem)
                        {
                            /* it's too long - note it and give up now */
                            err_expanded_line_too_long();
                            break;
                        }
                        else
                        {
                            /* success - advance past the value */
                            dst += vallen;
                        }

                        /* 
                         *   Skip to the close paren and continue with the
                         *   main loop.  We don't need to copy any input for
                         *   the symbol, because we've already copied the
                         *   expansion instead; so just go back to the start
                         *   of the input loop.  
                         */
                        p = closep;
                        continue;
                    }
                    else
                    {
                        /* ill-formed macro substitution expression */
                        err_invalid_dollar();
                    }
                }
                else if (*(p+1) == '$')
                {
                    /* 
                     *   we have a double dollar sign, so turn it into a
                     *   single dollar sign - simply skip the first of the
                     *   pair so we only keep one 
                     */
                    ++p;
                }
                else
                {
                    /* invalid '$' sequence - warn about it */
                    err_invalid_dollar();
                }
            }

            /* make sure we have room for this character plus a null byte */
            if ((dst - expbuf) + 2 > sizeof(expbuf))
            {
                err_expanded_line_too_long();
                break;
            }

            /* copy this character to the destination string */
            *dst++ = *p;
        }

        /* null-terminate the expanded buffer */
        *dst = '\0';

        /* skip leading spaces */
        for (p = expbuf ; isspace(*p) ; ++p) ;

        /* if the line is empty or starts with '#', skip it */
        if (*p == '\0' || *p == '#')
            continue;

        /* the variable name starts here */
        var_name = p;

        /* the variable name ends at the next space or colon */
        for ( ; *p != '\0' && *p != ':' && !isspace(*p) ; ++p) ;

        /* note where the variable name ends */
        sep = p;

        /* skip spaces after the end of the variable name */
        for ( ; isspace(*p) ; ++p) ;

        /* 
         *   if we didn't find a colon after the variable name, it's an
         *   error; flag the error and skip the line 
         */
        if (*p != ':')
        {
            /* check for stand-alone flags */
            if (stricmp(var_name, "nodef") == 0)
            {
                /* scan the "nodef" flag */
                scan_nodef();
            }
            else
            {
                /* 
                 *   it's not a valid stand-alone flag; the definition must
                 *   be missing the value portion 
                 */
                err_missing_colon();
                ++err_cnt_;
            }

            /* we're done with this line now */
            continue;
        }

        /* put a null terminator at the end of the variable name */
        *sep = '\0';

        /* skip any spaces after the colon */
        for (++p ; isspace(*p) ; ++p) ;

        /* the value starts here */
        var_val = p;

        /* scan the value */
        scan_var(var_name, var_val);
    }

    /* we're done - close the file */
    delete fp;
}